

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

int narrow_conv_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  double dVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  undefined4 *puVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  uint mode_00;
  int iVar9;
  ushort *puVar10;
  ushort *puVar11;
  BPropEntry *pBVar12;
  int in_EDX;
  uint in_ESI;
  long *in_RDI;
  double dVar13;
  int count;
  NarrowIns *savesp;
  BPropEntry *bp;
  IRRef mode;
  IRIns *cr;
  int32_t k;
  int64_t k64;
  lua_Number n;
  IRRef cref;
  IRIns *ir;
  jit_State *J;
  int in_stack_ffffffffffffffa8;
  IRRef in_stack_ffffffffffffffac;
  NarrowConv *in_stack_ffffffffffffffb0;
  uint local_2c;
  long lVar14;
  int local_4;
  
  lVar14 = *in_RDI;
  puVar10 = (ushort *)(*(long *)(lVar14 + 0x10) + (ulong)in_ESI * 8);
  if ((ulong)in_RDI[1] < (ulong)in_RDI[2]) {
    if ((*(char *)((long)puVar10 + 5) == 'Y') && ((puVar10[1] & 0x1f) == 0x13)) {
      if ((*(uint *)(in_RDI + 3) & 0xf000) < 0x1001) {
        narrow_stripov_backprop
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
      else {
        uVar3 = *puVar10;
        puVar4 = (uint *)in_RDI[1];
        in_RDI[1] = (long)(puVar4 + 1);
        *puVar4 = (uint)uVar3;
      }
      if (*(int *)((long)in_RDI + 0x1c) == 0x15) {
        puVar5 = (undefined4 *)in_RDI[1];
        in_RDI[1] = (long)(puVar5 + 1);
        *puVar5 = 0x20000;
      }
      local_4 = 0;
    }
    else if (*(char *)((long)puVar10 + 5) == '\x1c') {
      dVar1 = *(double *)(puVar10 + 4);
      if ((*(uint *)(in_RDI + 3) & 0xf000) == 0) {
        dVar13 = (double)(long)dVar1;
        if ((dVar1 == dVar13) && (!NAN(dVar1) && !NAN(dVar13))) {
          puVar5 = (undefined4 *)in_RDI[1];
          in_RDI[1] = (long)(puVar5 + 1);
          *puVar5 = 0x30000;
          puVar5 = (undefined4 *)in_RDI[1];
          in_RDI[1] = (long)(puVar5 + 1);
          *puVar5 = (int)(long)dVar1;
          return 0;
        }
      }
      else {
        iVar8 = (int)dVar1;
        if (iVar8 == (short)iVar8) {
          if ((dVar1 == (double)iVar8) && (!NAN(dVar1) && !NAN((double)iVar8))) {
            puVar5 = (undefined4 *)in_RDI[1];
            in_RDI[1] = (long)(puVar5 + 1);
            *puVar5 = 0x30000;
            piVar6 = (int *)in_RDI[1];
            in_RDI[1] = (long)(piVar6 + 1);
            *piVar6 = iVar8;
            return 0;
          }
        }
      }
      local_4 = 10;
    }
    else {
      uVar3 = *(ushort *)(lVar14 + 0x182 + (ulong)*(byte *)(lVar14 + 0xa5) * 2);
      while (local_2c = (uint)uVar3, in_ESI < local_2c) {
        puVar11 = (ushort *)(*(long *)(lVar14 + 0x10) + (ulong)local_2c * 8);
        if ((*puVar11 == in_ESI) &&
           ((*(char *)(lVar14 + 0xa5) == 'Z' ||
            (((puVar11[1] & 0xfff) == (*(uint *)(in_RDI + 3) & 0xfff) &&
             ((*(byte *)(lVar14 + 0xa4) & 0x80) <= ((byte)puVar11[2] & 0x80))))))) {
          puVar4 = (uint *)in_RDI[1];
          in_RDI[1] = (long)(puVar4 + 1);
          *puVar4 = local_2c;
          return 0;
        }
        uVar3 = puVar11[3];
      }
      if ((*(char *)((long)puVar10 + 5) == ')') || (*(char *)((long)puVar10 + 5) == '*')) {
        mode_00 = *(uint *)(in_RDI + 3);
        if (((mode_00 & 0xf000) == 0x2000) && (0 < in_EDX)) {
          mode_00 = mode_00 + 0x1000;
        }
        pBVar12 = narrow_bpc_get((jit_State *)*in_RDI,(IRRef1)in_ESI,mode_00);
        if (pBVar12 != (BPropEntry *)0x0) {
          uVar3 = pBVar12->val;
          puVar4 = (uint *)in_RDI[1];
          in_RDI[1] = (long)(puVar4 + 1);
          *puVar4 = (uint)uVar3;
          return 0;
        }
        if ((*(int *)((long)in_RDI + 0x1c) == 0x15) &&
           (pBVar12 = narrow_bpc_get((jit_State *)*in_RDI,(IRRef1)in_ESI,0x226e),
           pBVar12 != (BPropEntry *)0x0)) {
          uVar3 = pBVar12->val;
          puVar4 = (uint *)in_RDI[1];
          in_RDI[1] = (long)(puVar4 + 1);
          *puVar4 = (uint)uVar3;
          puVar5 = (undefined4 *)in_RDI[1];
          in_RDI[1] = (long)(puVar5 + 1);
          *puVar5 = 0x20000;
          return 0;
        }
        iVar8 = in_EDX + 1;
        if ((iVar8 < 100) && ((ulong)in_RDI[1] < (ulong)in_RDI[2])) {
          lVar7 = in_RDI[1];
          iVar9 = narrow_conv_backprop
                            ((NarrowConv *)CONCAT44(in_ESI,iVar8),(IRRef)((ulong)lVar14 >> 0x20),
                             (int)lVar14);
          iVar8 = narrow_conv_backprop
                            ((NarrowConv *)CONCAT44(in_ESI,iVar8),(IRRef)((ulong)lVar14 >> 0x20),
                             (int)lVar14);
          if ((iVar8 + iVar9 < 2) && ((ulong)in_RDI[1] < (ulong)in_RDI[2])) {
            bVar2 = *(byte *)((long)puVar10 + 5);
            piVar6 = (int *)in_RDI[1];
            in_RDI[1] = (long)(piVar6 + 1);
            *piVar6 = ((uint)bVar2 << 8 | *(uint *)((long)in_RDI + 0x1c)) * 0x10000 + in_ESI;
            return iVar8 + iVar9;
          }
          in_RDI[1] = lVar7;
        }
      }
      piVar6 = (int *)in_RDI[1];
      in_RDI[1] = (long)(piVar6 + 1);
      *piVar6 = in_ESI + 0x10000;
      local_4 = 1;
    }
  }
  else {
    local_4 = 10;
  }
  return local_4;
}

Assistant:

static int narrow_conv_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  IRRef cref;

  if (nc->sp >= nc->maxsp) return 10;  /* Path too deep. */

  /* Check the easy cases first. */
  if (ir->o == IR_CONV && (ir->op2 & IRCONV_SRCMASK) == IRT_INT) {
    if ((nc->mode & IRCONV_CONVMASK) <= IRCONV_ANY)
      narrow_stripov_backprop(nc, ir->op1, depth+1);
    else
      *nc->sp++ = NARROWINS(NARROW_REF, ir->op1);  /* Undo conversion. */
    if (nc->t == IRT_I64)
      *nc->sp++ = NARROWINS(NARROW_SEXT, 0);  /* Sign-extend integer. */
    return 0;
  } else if (ir->o == IR_KNUM) {  /* Narrow FP constant. */
    lua_Number n = ir_knum(ir)->n;
    if ((nc->mode & IRCONV_CONVMASK) == IRCONV_TOBIT) {
      /* Allows a wider range of constants. */
      int64_t k64 = (int64_t)n;
      if (n == (lua_Number)k64) {  /* Only if const doesn't lose precision. */
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k64;  /* But always truncate to 32 bits. */
	return 0;
      }
    } else {
      int32_t k = lj_num2int(n);
      /* Only if constant is a small integer. */
      if (checki16(k) && n == (lua_Number)k) {
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k;
	return 0;
      }
    }
    return 10;  /* Never narrow other FP constants (this is rare). */
  }

  /* Try to CSE the conversion. Stronger checks are ok, too. */
  cref = J->chain[fins->o];
  while (cref > ref) {
    IRIns *cr = IR(cref);
    if (cr->op1 == ref &&
	(fins->o == IR_TOBIT ||
	 ((cr->op2 & IRCONV_MODEMASK) == (nc->mode & IRCONV_MODEMASK) &&
	  irt_isguard(cr->t) >= irt_isguard(fins->t)))) {
      *nc->sp++ = NARROWINS(NARROW_REF, cref);
      return 0;  /* Already there, no additional conversion needed. */
    }
    cref = cr->prev;
  }

  /* Backpropagate across ADD/SUB. */
  if (ir->o == IR_ADD || ir->o == IR_SUB) {
    /* Try cache lookup first. */
    IRRef mode = nc->mode;
    BPropEntry *bp;
    /* Inner conversions need a stronger check. */
    if ((mode & IRCONV_CONVMASK) == IRCONV_INDEX && depth > 0)
      mode += IRCONV_CHECK-IRCONV_INDEX;
    bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
    if (bp) {
      *nc->sp++ = NARROWINS(NARROW_REF, bp->val);
      return 0;
    } else if (nc->t == IRT_I64) {
      /* Try sign-extending from an existing (checked) conversion to int. */
      mode = (IRT_INT<<5)|IRT_NUM|IRCONV_INDEX;
      bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
      if (bp) {
	*nc->sp++ = NARROWINS(NARROW_REF, bp->val);
	*nc->sp++ = NARROWINS(NARROW_SEXT, 0);
	return 0;
      }
    }
    if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      int count = narrow_conv_backprop(nc, ir->op1, depth);
      count += narrow_conv_backprop(nc, ir->op2, depth);
      /* Limit total number of conversions. */
      if (count <= 1 && nc->sp < nc->maxsp) {
	*nc->sp++ = NARROWINS(IRT(ir->o, nc->t), ref);
	return count;
      }
      nc->sp = savesp;  /* Too many conversions, need to backtrack. */
    }
  }

  /* Otherwise add a conversion. */
  *nc->sp++ = NARROWINS(NARROW_CONV, ref);
  return 1;
}